

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KVStringPair.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::KVStringPair::KVStringPair
          (KVStringPair *this,XMLCh *key,XMLSize_t keyLength,XMLCh *value,XMLSize_t valueLength,
          MemoryManager *manager)

{
  MemoryManager *manager_local;
  XMLSize_t valueLength_local;
  XMLCh *value_local;
  XMLSize_t keyLength_local;
  XMLCh *key_local;
  KVStringPair *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__KVStringPair_00524c90;
  this->fKeyAllocSize = 0;
  this->fValueAllocSize = 0;
  this->fKey = (XMLCh *)0x0;
  this->fValue = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  setKey(this,key,keyLength);
  setValue(this,value,valueLength);
  return;
}

Assistant:

KVStringPair::KVStringPair(const XMLCh* const key,
                           const XMLSize_t    keyLength,
                           const XMLCh* const value,
                           const XMLSize_t    valueLength,
                           MemoryManager* const manager)
:fKeyAllocSize(0)
,fValueAllocSize(0)
,fKey(0)
,fValue(0)
,fMemoryManager(manager)
{    
    setKey(key, keyLength);
    setValue(value, valueLength);
}